

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assignment.cpp
# Opt level: O1

double sq_err(array<double,_5UL> *a1,array<double,_5UL> *a2)

{
  size_t i;
  long lVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = 0.0;
  lVar1 = 0;
  do {
    dVar3 = a1->_M_elems[lVar1] - a2->_M_elems[lVar1];
    dVar2 = dVar2 + dVar3 * dVar3;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return dVar2;
}

Assistant:

double sq_err(const std::array<double, test_len>& a1,
              const std::array<double, test_len>& a2) {
    double se {0};
    
    for (size_t i {0} ; i < test_len ; i++) {
        double e { a1[i] - a2[i] };
        se += e*e;
    }
    
    return se;
}